

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O3

string * __thiscall
t_swift_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_type *ttype,bool is_optional,
          bool is_forced)

{
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined4 extraout_var;
  long *plVar5;
  size_type *psVar6;
  ulong *puVar7;
  t_program *program;
  undefined8 uVar8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
      if ((char)iVar1 == '\0') {
        iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
        if ((char)iVar1 == '\0') {
          if ((this->namespaced_ == true) &&
             ((t_swift_generator *)ttype->program_ !=
              (t_swift_generator *)(this->super_t_oop_generator).super_t_generator.program_)) {
            get_real_swift_module_abi_cxx11_(&local_d0,(t_swift_generator *)ttype->program_,program)
            ;
            plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
            psVar6 = (size_type *)(plVar2 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar2 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_f0.field_2._M_allocated_capacity = *psVar6;
              local_f0.field_2._8_8_ = plVar2[3];
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            }
            else {
              local_f0.field_2._M_allocated_capacity = *psVar6;
              local_f0._M_dataplus._M_p = (pointer)*plVar2;
            }
            local_f0._M_string_length = plVar2[1];
            *plVar2 = (long)psVar6;
            plVar2[1] = 0;
            *(undefined1 *)(plVar2 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
          }
          iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,*(ulong *)CONCAT44(extraout_var,iVar1));
          goto LAB_00352d1d;
        }
        type_name_abi_cxx11_(&local_b0,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,false,false);
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x3aace4);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar6 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_d0.field_2._M_allocated_capacity = *psVar6;
          local_d0.field_2._8_8_ = puVar3[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar6;
          local_d0._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_d0._M_string_length = puVar3[1];
        *puVar3 = psVar6;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        psVar6 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_f0.field_2._M_allocated_capacity = *psVar6;
          local_f0.field_2._8_8_ = puVar3[3];
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar6;
          local_f0._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_f0._M_string_length = puVar3[1];
        *puVar3 = psVar6;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
      }
      else {
        type_name_abi_cxx11_(&local_b0,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,false,false);
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x3aacde);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar6 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_d0.field_2._M_allocated_capacity = *psVar6;
          local_d0.field_2._8_8_ = puVar3[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar6;
          local_d0._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_d0._M_string_length = puVar3[1];
        *puVar3 = psVar6;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        psVar6 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_f0.field_2._M_allocated_capacity = *psVar6;
          local_f0.field_2._8_8_ = puVar3[3];
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar6;
          local_f0._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_f0._M_string_length = puVar3[1];
        *puVar3 = psVar6;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      paVar4 = &local_b0.field_2;
    }
    else {
      type_name_abi_cxx11_(&local_50,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,false,false);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x3aacd8);
      local_70 = &local_60;
      plVar5 = plVar2 + 2;
      if ((long *)*plVar2 == plVar5) {
        local_60 = *plVar5;
        lStack_58 = plVar2[3];
      }
      else {
        local_60 = *plVar5;
        local_70 = (long *)*plVar2;
      }
      local_68 = plVar2[1];
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
      paVar4 = &local_b0.field_2;
      puVar7 = (ulong *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_b0.field_2._M_allocated_capacity = *puVar7;
        local_b0.field_2._8_8_ = plVar2[3];
        local_b0._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *puVar7;
        local_b0._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_b0._M_string_length = plVar2[1];
      *plVar2 = (long)puVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      type_name_abi_cxx11_
                (&local_90,this,*(t_type **)&ttype[1].annotations_._M_t._M_impl,false,false);
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar4) {
        uVar8 = local_b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_90._M_string_length + local_b0._M_string_length) {
        uVar8 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          uVar8 = local_90.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar8 < local_90._M_string_length + local_b0._M_string_length) goto LAB_00352a42;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_90,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
      }
      else {
LAB_00352a42:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90._M_dataplus._M_p)
        ;
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      psVar6 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_d0.field_2._M_allocated_capacity = *psVar6;
        local_d0.field_2._8_8_ = puVar3[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar6;
        local_d0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_d0._M_string_length = puVar3[1];
      *puVar3 = psVar6;
      puVar3[1] = 0;
      *(undefined1 *)psVar6 = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
      psVar6 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_f0.field_2._M_allocated_capacity = *psVar6;
        local_f0.field_2._8_8_ = puVar3[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar6;
        local_f0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_f0._M_string_length = puVar3[1];
      *puVar3 = psVar6;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar4) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      paVar4 = &local_50.field_2;
    }
  }
  else {
    base_type_name_abi_cxx11_(&local_f0,this,(t_base_type *)ttype);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p)
    ;
    paVar4 = &local_f0.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar4->_M_allocated_capacity)[-2] != paVar4) {
    operator_delete((undefined1 *)(&paVar4->_M_allocated_capacity)[-2]);
  }
LAB_00352d1d:
  if (is_optional) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (is_forced) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::type_name(t_type* ttype, bool is_optional, bool is_forced) {
  string result = "";

  if (ttype->is_base_type()) {
    result += base_type_name((t_base_type*)ttype);
  } else if (ttype->is_map()) {
    t_map *map = (t_map *)ttype;
    result += "TMap<" + type_name(map->get_key_type()) + ", " + type_name(map->get_val_type()) + ">";
  } else if (ttype->is_set()) {
    t_set *set = (t_set *)ttype;
    result += "TSet<" + type_name(set->get_elem_type()) + ">";
  } else if (ttype->is_list()) {
    t_list *list = (t_list *)ttype;
    result += "TList<" + type_name(list->get_elem_type()) + ">";
  }
  else {
    t_program* program = ttype->get_program();
    if (namespaced_ && program != program_) {
      result += get_real_swift_module(program) + ".";
    }
    result += ttype->get_name();
  }

  if (is_optional) {
    result += "?";
  }
  if (is_forced) {
    result += "!";
  }

  return result;
}